

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

Vector3 __thiscall xatlas::internal::Mesh::computeFaceNormal(Mesh *this,uint32_t face)

{
  float *pfVar1;
  uint uVar2;
  uint uVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uint uVar6;
  char *__function;
  float fVar7;
  float fVar9;
  undefined8 uVar8;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  Vector3 VVar15;
  
  uVar6 = face * 3;
  uVar2 = (this->m_indices).m_base.size;
  if (uVar6 < uVar2) {
    puVar4 = (this->m_indices).m_base.buffer;
    uVar3 = (this->m_positions).m_base.size;
    if (*(uint *)(puVar4 + (ulong)uVar6 * 4) < uVar3) {
      if (uVar2 <= uVar6 + 1) goto LAB_001adff0;
      if (*(uint *)(puVar4 + (ulong)(uVar6 + 1) * 4) < uVar3) {
        if (uVar2 <= uVar6 + 2) goto LAB_001adff0;
        uVar2 = *(uint *)(puVar4 + (ulong)(uVar6 + 2) * 4);
        if (uVar2 < uVar3) {
          puVar5 = (this->m_positions).m_base.buffer;
          pfVar1 = (float *)(puVar5 + (ulong)*(uint *)(puVar4 + (ulong)(uVar6 + 1) * 4) * 0xc);
          fVar13 = *(float *)(puVar5 + (ulong)*(uint *)(puVar4 + (ulong)uVar6 * 4) * 0xc);
          fVar11 = *(float *)(puVar5 + (ulong)uVar2 * 0xc) - fVar13;
          uVar8 = *(undefined8 *)
                   ((long)(puVar5 + (ulong)*(uint *)(puVar4 + (ulong)uVar6 * 4) * 0xc) + 4);
          fVar10 = (float)uVar8;
          fVar7 = (float)*(undefined8 *)(puVar5 + (ulong)uVar2 * 0xc + 4) - fVar10;
          fVar12 = (float)((ulong)uVar8 >> 0x20);
          fVar9 = (float)((ulong)*(undefined8 *)(puVar5 + (ulong)uVar2 * 0xc + 4) >> 0x20) - fVar12;
          fVar10 = pfVar1[1] - fVar10;
          fVar12 = pfVar1[2] - fVar12;
          fVar13 = *pfVar1 - fVar13;
          fVar14 = fVar7 * fVar12 - fVar10 * fVar9;
          fVar12 = fVar9 * fVar13 - fVar12 * fVar11;
          fVar7 = fVar10 * fVar11 - fVar13 * fVar7;
          fVar13 = SQRT(fVar7 * fVar7 + fVar14 * fVar14 + fVar12 * fVar12);
          fVar9 = 1.0 / fVar13;
          uVar8 = CONCAT44(fVar9 * fVar12,fVar9 * fVar14);
          if ((fVar13 == 0.0) && (!NAN(fVar13))) {
            uVar8 = 0;
          }
          fVar7 = fVar7 * fVar9;
          if ((fVar13 == 0.0) && (!NAN(fVar13))) {
            fVar7 = 1.0;
          }
          VVar15.z = fVar7;
          VVar15.x = (float)(int)uVar8;
          VVar15.y = (float)(int)((ulong)uVar8 >> 0x20);
          return VVar15;
        }
      }
    }
    __function = 
    "const T &xatlas::internal::Array<xatlas::internal::Vector3>::operator[](uint32_t) const [T = xatlas::internal::Vector3]"
    ;
  }
  else {
LAB_001adff0:
    __function = 
    "const T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) const [T = unsigned int]";
  }
  __assert_fail("index < m_base.size",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                ,0x4a8,__function);
}

Assistant:

Vector3 computeFaceNormal(uint32_t face) const
	{
		const Vector3 &p0 = m_positions[m_indices[face * 3 + 0]];
		const Vector3 &p1 = m_positions[m_indices[face * 3 + 1]];
		const Vector3 &p2 = m_positions[m_indices[face * 3 + 2]];
		const Vector3 e0 = p2 - p0;
		const Vector3 e1 = p1 - p0;
		const Vector3 normalAreaScaled = cross(e0, e1);
		return normalizeSafe(normalAreaScaled, Vector3(0, 0, 1), 0.0f);
	}